

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::AddKeepPath(string *dir)

{
  string local_50;
  undefined1 local_30 [8];
  string cdir;
  string *dir_local;
  
  cdir.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)local_30);
  CollapseFullPath(&local_50,(string *)cdir.field_2._8_8_);
  Realpath(&local_50,(string *)local_30,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  AddTranslationPath((string *)local_30,(string *)cdir.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void SystemTools::AddKeepPath(const std::string& dir)
{
  std::string cdir;
  Realpath(SystemTools::CollapseFullPath(dir), cdir);
  SystemTools::AddTranslationPath(cdir, dir);
}